

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O2

void __thiscall
FIX::SocketAcceptor::onConnect
          (SocketAcceptor *this,SocketServer *server,socket_handle a,socket_handle s)

{
  NullLog *pNVar1;
  socket_handle s_00;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  *__x;
  SocketConnection *this_00;
  mapped_type *ppSVar5;
  ostream *poVar6;
  char *pcVar7;
  NullLog *pNVar8;
  uint16_t port;
  Sessions sessions;
  stringstream stream;
  socket_handle local_240;
  ushort local_23a;
  string local_238 [32];
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_218;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_240 = s;
  bVar2 = socket_isValid(s);
  if (bVar2) {
    iVar4 = std::
            _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
            ::find(&(this->m_connections)._M_t,&local_240);
    if ((_Rb_tree_header *)iVar4._M_node ==
        &(this->m_connections)._M_t._M_impl.super__Rb_tree_header) {
      iVar3 = SocketServer::socketToPort(server,a);
      local_23a = (ushort)iVar3;
      __x = &std::
             map<unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
             ::operator[](&this->m_portToSessions,&local_23a)->_M_t;
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::_Rb_tree(&local_1e8,__x);
      this_00 = (SocketConnection *)operator_new(0x2100);
      s_00 = local_240;
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::_Rb_tree(&local_218,&local_1e8);
      SocketConnection::SocketConnection(this_00,s_00,(Sessions *)&local_218,&server->m_monitor);
      ppSVar5 = std::
                map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
                ::operator[](&this->m_connections,&local_240);
      *ppSVar5 = this_00;
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree(&local_218);
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar6 = std::operator<<(local_1a8,"Accepted connection from ");
      pcVar7 = socket_peername(local_240);
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6," on port ");
      std::ostream::operator<<(poVar6,local_23a);
      pNVar1 = (NullLog *)(this->super_Acceptor).m_pLog;
      std::__cxx11::stringbuf::str();
      pNVar8 = &(this->super_Acceptor).m_nullLog;
      if (pNVar1 != (NullLog *)0x0) {
        pNVar8 = pNVar1;
      }
      (*(pNVar8->super_Log)._vptr_Log[6])(pNVar8,local_238);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree(&local_1e8);
    }
  }
  return;
}

Assistant:

void SocketAcceptor::onConnect(SocketServer &server, socket_handle a, socket_handle s) {
  if (!socket_isValid(s)) {
    return;
  }
  SocketConnections::iterator i = m_connections.find(s);
  if (i != m_connections.end()) {
    return;
  }
  uint16_t port = server.socketToPort(a);
  Sessions sessions = m_portToSessions[port];
  m_connections[s] = new SocketConnection(s, sessions, &server.getMonitor());

  std::stringstream stream;
  stream << "Accepted connection from " << socket_peername(s) << " on port " << port;

  if (getLog()) {
    getLog()->onEvent(stream.str());
  }
}